

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# san_bump.c
# Opt level: O1

edata_t * duckdb_je_san_bump_alloc
                    (tsdn_t *tsdn,san_bump_alloc_t *sba,pac_t *pac,ehooks_t *ehooks,size_t size,
                    _Bool zero)

{
  pthread_mutex_t *__mutex;
  uint64_t *puVar1;
  witness_t **ppwVar2;
  pac_t *pac_00;
  ehooks_t *ehooks_00;
  _Bool _Var3;
  int iVar4;
  edata_t *peVar5;
  edata_t *peVar6;
  edata_t *edata;
  undefined7 in_register_00000089;
  size_t sVar7;
  mutex_prof_data_t *data;
  ulong size_a;
  _Bool committed;
  _Bool local_49;
  pac_t *local_48;
  ehooks_t *local_40;
  undefined4 local_34;
  
  local_34 = (undefined4)CONCAT71(in_register_00000089,zero);
  __mutex = (pthread_mutex_t *)((long)&(sba->mtx).field_0 + 0x48);
  local_48 = pac;
  local_40 = ehooks;
  iVar4 = pthread_mutex_trylock(__mutex);
  if (iVar4 != 0) {
    duckdb_je_malloc_mutex_lock_slow(&sba->mtx);
    (sba->mtx).field_0.field_0.locked.repr = true;
  }
  puVar1 = &(sba->mtx).field_0.field_0.prof_data.n_lock_ops;
  *puVar1 = *puVar1 + 1;
  if ((sba->mtx).field_0.field_0.prof_data.prev_owner != tsdn) {
    (sba->mtx).field_0.field_0.prof_data.prev_owner = tsdn;
    ppwVar2 = &(sba->mtx).field_0.witness.link.qre_prev;
    *ppwVar2 = (witness_t *)((long)&(*ppwVar2)->name + 1);
  }
  size_a = size + 0x1000;
  edata = sba->curr_reg;
  if ((edata == (edata_t *)0x0) || (((edata->field_2).e_size_esn & 0xfffffffffffff000) < size_a)) {
    local_49 = false;
    sVar7 = 0x400000;
    if (0x400000 < size_a) {
      sVar7 = size_a;
    }
    peVar5 = duckdb_je_extent_alloc_wrapper
                       (tsdn,local_48,local_40,(void *)0x0,sVar7,0x1000,false,&local_49,true);
    sba->curr_reg = peVar5;
    if (peVar5 != (edata_t *)0x0) goto LAB_011ad41c;
LAB_011ad4ff:
    (sba->mtx).field_0.field_0.locked.repr = false;
    pthread_mutex_unlock(__mutex);
  }
  else {
    edata = (edata_t *)0x0;
LAB_011ad41c:
    peVar5 = sba->curr_reg;
    sVar7 = ((peVar5->field_2).e_size_esn & 0xfffffffffffff000) - size_a;
    if (sVar7 == 0) {
      sba->curr_reg = (edata_t *)0x0;
    }
    else {
      peVar6 = duckdb_je_extent_split_wrapper(tsdn,local_48,local_40,peVar5,size_a,sVar7,true);
      if (peVar6 == (edata_t *)0x0) goto LAB_011ad4ff;
      peVar5 = sba->curr_reg;
      sba->curr_reg = peVar6;
    }
    (sba->mtx).field_0.field_0.locked.repr = false;
    pthread_mutex_unlock(__mutex);
    ehooks_00 = local_40;
    pac_00 = local_48;
    if (edata != (edata_t *)0x0) {
      duckdb_je_extent_destroy_wrapper(tsdn,local_48,local_40,edata);
    }
    duckdb_je_san_guard_pages(tsdn,ehooks_00,peVar5,pac_00->emap,false,true,true);
    _Var3 = duckdb_je_extent_commit_zero(tsdn,ehooks_00,peVar5,true,local_34._0_1_,false);
    if (!_Var3) {
      return peVar5;
    }
    duckdb_je_extent_record(tsdn,pac_00,ehooks_00,&pac_00->ecache_retained,peVar5);
  }
  return (edata_t *)0x0;
}

Assistant:

edata_t *
san_bump_alloc(tsdn_t *tsdn, san_bump_alloc_t* sba, pac_t *pac,
    ehooks_t *ehooks, size_t size, bool zero) {
	assert(san_bump_enabled());

	edata_t* to_destroy;
	size_t guarded_size = san_one_side_guarded_sz(size);

	malloc_mutex_lock(tsdn, &sba->mtx);

	if (sba->curr_reg == NULL ||
	    edata_size_get(sba->curr_reg) < guarded_size) {
		/*
		 * If the current region can't accommodate the allocation,
		 * try replacing it with a larger one and destroy current if the
		 * replacement succeeds.
		 */
		to_destroy = sba->curr_reg;
		bool err = san_bump_grow_locked(tsdn, sba, pac, ehooks,
		    guarded_size);
		if (err) {
			goto label_err;
		}
	} else {
		to_destroy = NULL;
	}
	assert(guarded_size <= edata_size_get(sba->curr_reg));
	size_t trail_size = edata_size_get(sba->curr_reg) - guarded_size;

	edata_t* edata;
	if (trail_size != 0) {
		edata_t* curr_reg_trail = extent_split_wrapper(tsdn, pac,
		    ehooks, sba->curr_reg, guarded_size, trail_size,
		    /* holding_core_locks */ true);
		if (curr_reg_trail == NULL) {
			goto label_err;
		}
		edata = sba->curr_reg;
		sba->curr_reg = curr_reg_trail;
	} else {
		edata = sba->curr_reg;
		sba->curr_reg = NULL;
	}

	malloc_mutex_unlock(tsdn, &sba->mtx);

	assert(!edata_guarded_get(edata));
	assert(sba->curr_reg == NULL || !edata_guarded_get(sba->curr_reg));
	assert(to_destroy == NULL || !edata_guarded_get(to_destroy));

	if (to_destroy != NULL) {
		extent_destroy_wrapper(tsdn, pac, ehooks, to_destroy);
	}

	san_guard_pages(tsdn, ehooks, edata, pac->emap, /* left */ false,
	    /* right */ true, /* remap */ true);

	if (extent_commit_zero(tsdn, ehooks, edata, /* commit */ true, zero,
	    /* growing_retained */ false)) {
		extent_record(tsdn, pac, ehooks, &pac->ecache_retained,
		    edata);
		return NULL;
	}

	if (config_prof) {
		extent_gdump_add(tsdn, edata);
	}

	return edata;
label_err:
	malloc_mutex_unlock(tsdn, &sba->mtx);
	return NULL;
}